

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffgcnn(fitsfile *fptr,int casesen,char *templt,char *colname,int *colnum,int *status)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  FITSfile *pFVar6;
  tcolumn *colname_00;
  int tstatus;
  int exact;
  int match;
  long ivalue;
  char errmsg [81];
  int local_ac;
  char *local_a8;
  int local_a0;
  int local_9c;
  int *local_98;
  long local_90;
  char local_88 [88];
  
  iVar1 = *status;
  if (iVar1 < 1) {
    fptr->Fptr->startcol = 0;
    local_ac = 0;
  }
  else {
    if (iVar1 != 0xed) {
      return iVar1;
    }
    local_ac = 0xed;
    *status = 0;
  }
  *colname = '\0';
  *colnum = 0;
  local_a8 = colname;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar5 = ffrdef(fptr,status), 0 < iVar5))
    goto LAB_0013ce9a;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar6 = fptr->Fptr;
  iVar5 = pFVar6->startcol;
  if (iVar5 < pFVar6->tfield) {
    colname_00 = pFVar6->tableptr + iVar5;
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
    local_98 = status;
    do {
      ffcmps(templt,colname_00->ttype,casesen,&local_9c,&local_a0);
      if (local_9c != 0) {
        if (local_a0 != 0 && bVar2) {
          pFVar6->startcol = *colnum;
          *local_98 = 0xed;
          return 0xed;
        }
        if (!bVar2) {
          if (local_a0 == 0) {
            bVar2 = false;
            if (bVar3) {
              bVar3 = true;
              bVar4 = false;
              bVar2 = false;
            }
            else {
              strcpy(local_a8,colname_00->ttype);
              *colnum = iVar5 + 1;
              pFVar6 = fptr->Fptr;
              pFVar6->startcol = iVar5 + 1;
              bVar3 = true;
              bVar4 = true;
            }
            goto LAB_0013cd09;
          }
          strcpy(local_a8,colname_00->ttype);
          *colnum = iVar5 + 1;
          pFVar6 = fptr->Fptr;
        }
        bVar2 = true;
      }
LAB_0013cd09:
      iVar5 = iVar5 + 1;
      colname_00 = colname_00 + 1;
    } while (iVar5 < pFVar6->tfield);
    status = local_98;
    if (bVar2) {
      if (0 < iVar1) {
LAB_0013cdd7:
        *local_98 = 0xed;
      }
    }
    else {
      if (!bVar3) goto LAB_0013cde3;
      if (!bVar4 || 0 < iVar1) goto LAB_0013cdd7;
    }
  }
  else {
LAB_0013cde3:
    ffc2ii(templt,&local_90,&local_ac);
    if (local_ac == 0) {
      if ((local_90 < 1) || (pFVar6 = fptr->Fptr, pFVar6->tfield < local_90)) {
        *status = 0xdb;
        goto LAB_0013ce62;
      }
      *colnum = (int)local_90;
      strcpy(local_a8,pFVar6->tableptr[local_90 + -1].ttype);
      status = status;
    }
    else {
      *status = 0xdb;
      status = status;
      if (local_ac != 0xed) {
LAB_0013ce62:
        snprintf(local_88,0x51,"ffgcnn could not find column: %.45s",templt);
        ffxmsg(5,local_88);
        status = status;
      }
    }
  }
  fptr->Fptr->startcol = *colnum;
LAB_0013ce9a:
  return *status;
}

Assistant:

int ffgcnn( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  casesen,    /* I - case sensitive string comparison? 0=no  */
            char *templt,    /* I - input name of column (w/wildcards)      */
            char *colname,   /* O - full column name up to 68 + 1 chars long*/
            int  *colnum,    /* O - number of the named column; 1=first col */
            int  *status)    /* IO - error status                           */
/*
  Return the full column name and column number of the next column whose
  TTYPEn keyword value matches the input template string.
  The template may contain the * and ? wildcards.  Status = 237 is
  returned if the match is not unique.  If so, one may call this routine
  again with input status=237  to get the next match.  A status value of
  219 is returned when there are no more matching columns.
*/
{
    char errmsg[FLEN_ERRMSG];
    int tstatus, ii, founde, foundw, match, exact, unique;
    long ivalue;
    tcolumn *colptr;

    if (*status <= 0)
    {
        (fptr->Fptr)->startcol = 0;   /* start search with first column */
        tstatus = 0;
    }
    else if (*status == COL_NOT_UNIQUE) /* start search from previous spot */
    {
        tstatus = COL_NOT_UNIQUE;
        *status = 0;
    }
    else
        return(*status);  /* bad input status value */

    colname[0] = 0;    /* initialize null return */
    *colnum = 0;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)   /* rescan header to get col struct */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += ((fptr->Fptr)->startcol);      /* offset to starting column */

    founde = FALSE;   /* initialize 'found exact match' flag */
    foundw = FALSE;   /* initialize 'found wildcard match' flag */
    unique = FALSE;

    for (ii = (fptr->Fptr)->startcol; ii < (fptr->Fptr)->tfield; ii++, colptr++)
    {
        ffcmps(templt, colptr->ttype, casesen, &match, &exact);
        if (match)
        {
            if (founde && exact)
            {
                /* warning: this is the second exact match we've found     */
                /*reset pointer to first match so next search starts there */
               (fptr->Fptr)->startcol = *colnum;
               return(*status = COL_NOT_UNIQUE);
            }
            else if (founde)   /* a wildcard match */
            {
                /* already found exact match so ignore this non-exact match */
            }
            else if (exact)
            {
                /* this is the first exact match we have found, so save it. */
                strcpy(colname, colptr->ttype);
                *colnum = ii + 1;
                founde = TRUE;
            }
            else if (foundw)
            {
                /* we have already found a wild card match, so not unique */
                /* continue searching for other matches                   */
                unique = FALSE;
            }
            else
            {
               /* this is the first wild card match we've found. save it */
               strcpy(colname, colptr->ttype);
               *colnum = ii + 1;
               (fptr->Fptr)->startcol = *colnum;
               foundw = TRUE;
               unique = TRUE;
            }
        }
    }

    /* OK, we've checked all the names now see if we got any matches */
    if (founde)
    {
        if (tstatus == COL_NOT_UNIQUE)  /* we did find 1 exact match but */
            *status = COL_NOT_UNIQUE;   /* there was a previous match too */
    }
    else if (foundw)
    {
        /* found one or more wildcard matches; report error if not unique */
       if (!unique || tstatus == COL_NOT_UNIQUE)
           *status = COL_NOT_UNIQUE;
    }
    else
    {
        /* didn't find a match; check if template is a positive integer */
        ffc2ii(templt, &ivalue, &tstatus);
        if (tstatus ==  0 && ivalue <= (fptr->Fptr)->tfield && ivalue > 0)
        {
            *colnum = ivalue;

            colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
            colptr += (ivalue - 1);    /* offset to correct column */
            strcpy(colname, colptr->ttype);
        }
        else
        {
            *status = COL_NOT_FOUND;
            if (tstatus != COL_NOT_UNIQUE)
            {
              snprintf(errmsg, FLEN_ERRMSG, "ffgcnn could not find column: %.45s", templt);
              ffpmsg(errmsg);
            }
        }
    }
    
    (fptr->Fptr)->startcol = *colnum;  /* save pointer for next time */
    return(*status);
}